

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

void __thiscall
header_inclusion_csv_actions::module_start(header_inclusion_csv_actions *this,string *module)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(module->_M_dataplus)._M_p,module->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,s_csv_separator_abi_cxx11_._M_dataplus._M_p,
             s_csv_separator_abi_cxx11_._M_string_length);
  this->first_header = true;
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << module << s_csv_separator;
        first_header = true;
    }